

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::
ParserRefImpl<Catch::makeCommandLineParser(Catch::ConfigData&)::__5,void>
          (ParserRefImpl<Catch::Clara::Opt> *this,anon_class_8_1_50637480_for_m_lambda *ref,
          string *hint)

{
  shared_ptr<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2909:44)>_>
  local_30;
  string *local_20;
  string *hint_local;
  anon_class_8_1_50637480_for_m_lambda *ref_local;
  ParserRefImpl<Catch::Clara::Opt> *this_local;
  
  local_20 = hint;
  hint_local = (string *)ref;
  ref_local = (anon_class_8_1_50637480_for_m_lambda *)this;
  ComposableParserImpl<Catch::Clara::Opt>::ComposableParserImpl
            (&this->super_ComposableParserImpl<Catch::Clara::Opt>);
  (this->super_ComposableParserImpl<Catch::Clara::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_00500410;
  this->m_optionality = Optional;
  std::
  make_shared<Catch::Clara::Detail::BoundLambda<Catch::makeCommandLineParser(Catch::ConfigData&)::__5>,Catch::makeCommandLineParser(Catch::ConfigData&)::__5_const&>
            ((anon_class_8_1_50637480_for_m_lambda *)&local_30);
  std::shared_ptr<Catch::Clara::Detail::BoundRef>::
  shared_ptr<Catch::Clara::Detail::BoundLambda<Catch::makeCommandLineParser(Catch::ConfigData&)::__5>,void>
            (&this->m_ref,&local_30);
  std::
  shared_ptr<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2909:44)>_>
  ::~shared_ptr(&local_30);
  std::__cxx11::string::string((string *)&this->m_hint,(string *)local_20);
  std::__cxx11::string::string((string *)&this->m_description);
  return;
}

Assistant:

ParserRefImpl( LambdaT const& ref, std::string const& hint ):
                    m_ref( std::make_shared<BoundLambda<LambdaT>>( ref ) ),
                    m_hint( hint ) {}